

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O2

TiXmlString * __thiscall
despot::util::tinyxml::TiXmlString::assign(TiXmlString *this,char *str,size_type len)

{
  ulong uVar1;
  Rep *pRVar2;
  TiXmlString TVar3;
  TiXmlString tmp;
  TiXmlString local_30;
  
  uVar1 = this->rep_->capacity;
  if ((uVar1 < len) || (len * 3 + 0x18 < uVar1)) {
    local_30.rep_ = (Rep *)nullrep_;
    init(&local_30,(EVP_PKEY_CTX *)len);
    TVar3.rep_ = local_30.rep_;
    memcpy((local_30.rep_)->str,str,len);
    local_30 = (TiXmlString)this->rep_;
    this->rep_ = (Rep *)TVar3;
    quit(&local_30);
  }
  else {
    memmove(this->rep_->str,str,len);
    pRVar2 = this->rep_;
    pRVar2->size = len;
    pRVar2->str[len] = '\0';
  }
  return this;
}

Assistant:

TiXmlString& TiXmlString::assign(const char* str, size_type len) {
	size_type cap = capacity();
	if (len > cap || cap > 3 * (len + 8)) {
		TiXmlString tmp;
		tmp.init(len);
		memcpy(tmp.start(), str, len);
		swap(tmp);
	} else {
		memmove(start(), str, len);
		set_size(len);
	}
	return *this;
}